

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QCborValue * QCborValue::fromVariant(QCborValue *__return_storage_ptr__,QVariant *variant)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [8];
  undefined8 uVar9;
  QCborSimpleType QVar10;
  bool bVar11;
  int iVar12;
  Type TVar13;
  qlonglong qVar14;
  qulonglong qVar15;
  long in_FS_OFFSET;
  QJsonDocument doc;
  QJsonArray QStack_48;
  undefined1 local_40 [8];
  undefined1 local_38 [24];
  long local_20;
  
  local_38._8_8_ = local_38._0_8_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = ::QVariant::metaType(variant);
  iVar12 = QMetaType::registerHelper((QMetaType *)local_38);
  switch(iVar12) {
  case 0:
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Undefined;
    break;
  case 1:
    bVar11 = ::QVariant::toBool(variant);
    TVar13 = (uint)bVar11 | False;
    goto LAB_002c11e1;
  case 2:
  case 3:
  case 4:
  case 0x20:
  case 0x21:
  case 0x24:
    goto switchD_002c0ff7_caseD_2;
  case 5:
  case 0x23:
    qVar15 = ::QVariant::toULongLong(variant,(bool *)0x0);
    if ((long)qVar15 < 0) goto switchD_002c0ff7_caseD_6;
    goto switchD_002c0ff7_caseD_2;
  case 6:
  case 0x26:
  case 0x3f:
switchD_002c0ff7_caseD_6:
    dVar1 = ::QVariant::toDouble(variant,(bool *)0x0);
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Double;
    __return_storage_ptr__->n = (qint64)dVar1;
    break;
  default:
    bVar11 = ::QVariant::isNull(variant);
    if (!bVar11) {
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toString((QString *)local_38,variant);
      if ((uchar  [8])local_38._8_8_ == (uchar  [8])0x0) {
        __return_storage_ptr__->n = 0;
        __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
        __return_storage_ptr__->t = Undefined;
      }
      else {
        QCborValue((QCborValue *)__return_storage_ptr__,(QString *)local_38);
      }
      goto LAB_002c150f;
    }
  case 0x33:
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Null;
    break;
  case 8:
    ::QVariant::toMap((QVariant *)local_40);
    QCborMap::fromVariantMap((QCborMap *)local_38,(QVariantMap *)local_40);
    __return_storage_ptr__->n = -1;
    uVar9 = local_38._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar5 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar9;
    __return_storage_ptr__->t = Map;
    QCborMap::~QCborMap((QCborMap *)local_38);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)local_40);
    break;
  case 9:
    ::QVariant::toList((QVariantList *)local_38,variant);
    QCborArray::fromVariantList((QCborArray *)local_40,(QVariantList *)local_38);
    auVar8 = local_40;
    __return_storage_ptr__->n = -1;
    local_40 = (undefined1  [8])0x0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)auVar8;
    __return_storage_ptr__->t = Array;
    QCborArray::~QCborArray((QCborArray *)local_40);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_38);
    break;
  case 10:
    ::QVariant::toString((QString *)local_38,variant);
    QCborValue((QCborValue *)__return_storage_ptr__,(QString *)local_38);
LAB_002c150f:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_38);
    break;
  case 0xb:
    ::QVariant::toStringList((QStringList *)local_38,variant);
    QCborArray::fromStringList((QCborArray *)local_40,(QStringList *)local_38);
    auVar8 = local_40;
    __return_storage_ptr__->n = -1;
    local_40 = (undefined1  [8])0x0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)auVar8;
    __return_storage_ptr__->t = Array;
    QCborArray::~QCborArray((QCborArray *)local_40);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_38);
    break;
  case 0xc:
    ::QVariant::toByteArray((QByteArray *)local_38,variant);
    QCborValue((QCborValue *)__return_storage_ptr__,(QByteArray *)local_38);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_38);
    break;
  case 0x10:
    ::QVariant::toDateTime((QVariant *)local_38);
    QCborValue((QCborValue *)__return_storage_ptr__,(QDateTime *)local_38);
    QDateTime::~QDateTime((QDateTime *)local_38);
    break;
  case 0x11:
    ::QVariant::toUrl((QVariant *)local_38);
    QCborValue((QCborValue *)__return_storage_ptr__,(QUrl *)local_38);
    QUrl::~QUrl((QUrl *)local_38);
    break;
  case 0x1c:
    ::QVariant::toHash((QVariant *)local_40);
    QCborMap::fromVariantHash((QCborMap *)local_38,(QVariantHash *)local_40);
    __return_storage_ptr__->n = -1;
    uVar9 = local_38._0_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar2 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar9;
    __return_storage_ptr__->t = Map;
    QCborMap::~QCborMap((QCborMap *)local_38);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)local_40);
    break;
  case 0x1e:
    local_38._0_16_ = (undefined1  [16])::QVariant::toUuid(variant);
    QCborValue((QCborValue *)__return_storage_ptr__,(QUuid *)local_38);
    break;
  case 0x2c:
    ::QVariant::toRegularExpression((QVariant *)local_38);
    QCborValue((QCborValue *)__return_storage_ptr__,(QRegularExpression *)local_38);
    QRegularExpression::~QRegularExpression((QRegularExpression *)local_38);
    break;
  case 0x2d:
    ::QVariant::toJsonValue((QJsonValue *)local_38,variant);
    fromJsonValue(__return_storage_ptr__,(QJsonValue *)local_38);
    QJsonValue::~QJsonValue((QJsonValue *)local_38);
    break;
  case 0x2e:
    ::QVariant::toJsonObject((QVariant *)local_40);
    QCborMap::fromJsonObject((QCborMap *)local_38,(QJsonObject *)local_40);
    __return_storage_ptr__->n = -1;
    uVar9 = local_38._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar3 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar9;
    __return_storage_ptr__->t = Map;
    QCborMap::~QCborMap((QCborMap *)local_38);
    QJsonObject::~QJsonObject((QJsonObject *)local_40);
    break;
  case 0x2f:
    ::QVariant::toJsonArray((QVariant *)local_40);
    QCborArray::fromJsonArray((QCborArray *)local_38,(QJsonArray *)local_40);
    __return_storage_ptr__->n = -1;
    uVar9 = local_38._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar7 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar9;
    __return_storage_ptr__->t = Array;
    QCborArray::~QCborArray((QCborArray *)local_38);
    QJsonArray::~QJsonArray((QJsonArray *)local_40);
    break;
  case 0x30:
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toJsonDocument((QVariant *)local_38);
    bVar11 = QJsonDocument::isArray((QJsonDocument *)local_38);
    if (bVar11) {
      QJsonDocument::array((QJsonDocument *)&QStack_48);
      QCborArray::fromJsonArray((QCborArray *)local_40,&QStack_48);
      auVar8 = local_40;
      __return_storage_ptr__->n = -1;
      local_40 = (undefined1  [8])0x0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)auVar8;
      __return_storage_ptr__->t = Array;
      QCborArray::~QCborArray((QCborArray *)local_40);
      QJsonArray::~QJsonArray(&QStack_48);
    }
    else {
      QJsonDocument::object((QJsonDocument *)&QStack_48);
      QCborMap::fromJsonObject((QCborMap *)local_40,(QJsonObject *)&QStack_48);
      auVar8 = local_40;
      __return_storage_ptr__->n = -1;
      local_40 = (undefined1  [8])0x0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)auVar8;
      __return_storage_ptr__->t = Map;
      QCborMap::~QCborMap((QCborMap *)local_40);
      QJsonObject::~QJsonObject((QJsonObject *)&QStack_48);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_38);
    break;
  case 0x34:
    QVar10 = qvariant_cast<QCborSimpleType>(variant);
    TVar13 = (uint)QVar10 | SimpleType;
LAB_002c11e1:
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = TVar13;
    break;
  case 0x35:
    qvariant_cast<QCborValue>(__return_storage_ptr__,variant);
    break;
  case 0x36:
    qvariant_cast<QCborArray>((QVariant *)local_38);
    __return_storage_ptr__->n = -1;
    uVar9 = local_38._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar6 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar9;
    __return_storage_ptr__->t = Array;
    QCborArray::~QCborArray((QCborArray *)local_38);
    break;
  case 0x37:
    qvariant_cast<QCborMap>((QVariant *)local_38);
    __return_storage_ptr__->n = -1;
    uVar9 = local_38._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar4 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar9;
    __return_storage_ptr__->t = Map;
    QCborMap::~QCborMap((QCborMap *)local_38);
  }
LAB_002c1519:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
switchD_002c0ff7_caseD_2:
  qVar14 = ::QVariant::toLongLong(variant,(bool *)0x0);
  __return_storage_ptr__->n = qVar14;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Integer;
  goto LAB_002c1519;
}

Assistant:

QCborValue QCborValue::fromVariant(const QVariant &variant)
{
    switch (variant.metaType().id()) {
    case QMetaType::UnknownType:
        return {};
    case QMetaType::Nullptr:
        return nullptr;
    case QMetaType::Bool:
        return variant.toBool();
    case QMetaType::Short:
    case QMetaType::UShort:
    case QMetaType::Int:
    case QMetaType::LongLong:
    case QMetaType::Long:
    case QMetaType::UInt:
        return variant.toLongLong();
    case QMetaType::ULong:
    case QMetaType::ULongLong:
        if (variant.toULongLong() <= static_cast<uint64_t>(std::numeric_limits<qint64>::max()))
            return variant.toLongLong();
        Q_FALLTHROUGH();
    case QMetaType::Float16:
    case QMetaType::Float:
    case QMetaType::Double:
        return variant.toDouble();
    case QMetaType::QString:
        return variant.toString();
    case QMetaType::QStringList:
        return QCborArray::fromStringList(variant.toStringList());
    case QMetaType::QByteArray:
        return variant.toByteArray();
#if QT_CONFIG(datestring)
    case QMetaType::QDateTime:
        return QCborValue(variant.toDateTime());
#endif
#ifndef QT_BOOTSTRAPPED
    case QMetaType::QUrl:
        return QCborValue(variant.toUrl());
    case QMetaType::QUuid:
        return QCborValue(variant.toUuid());
#endif
    case QMetaType::QVariantList:
        return QCborArray::fromVariantList(variant.toList());
    case QMetaType::QVariantMap:
        return QCborMap::fromVariantMap(variant.toMap());
    case QMetaType::QVariantHash:
        return QCborMap::fromVariantHash(variant.toHash());
#ifndef QT_BOOTSTRAPPED
#if QT_CONFIG(regularexpression)
    case QMetaType::QRegularExpression:
        return QCborValue(variant.toRegularExpression());
#endif
    case QMetaType::QJsonValue:
        return fromJsonValue(variant.toJsonValue());
    case QMetaType::QJsonObject:
        return QCborMap::fromJsonObject(variant.toJsonObject());
    case QMetaType::QJsonArray:
        return QCborArray::fromJsonArray(variant.toJsonArray());
    case QMetaType::QJsonDocument: {
        QJsonDocument doc = variant.toJsonDocument();
        if (doc.isArray())
            return QCborArray::fromJsonArray(doc.array());
        return QCborMap::fromJsonObject(doc.object());
    }
    case QMetaType::QCborValue:
        return qvariant_cast<QCborValue>(variant);
    case QMetaType::QCborArray:
        return qvariant_cast<QCborArray>(variant);
    case QMetaType::QCborMap:
        return qvariant_cast<QCborMap>(variant);
    case QMetaType::QCborSimpleType:
        return qvariant_cast<QCborSimpleType>(variant);
#endif
    default:
        break;
    }

    if (variant.isNull())
        return QCborValue(nullptr);

    QString string = variant.toString();
    if (string.isNull())
        return QCborValue();        // undefined
    return string;
}